

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O3

void pztopology::TPZTriangle::ComputeHCurlFaceDirections<Fad<double>>
               (TPZVec<Fad<double>_> *v1,TPZVec<Fad<double>_> *v2,int transformationId)

{
  Fad<double> *pFVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  double local_40;
  TPZVec<Fad<double>_> *local_38;
  
  lVar3 = 0;
  bVar2 = true;
  local_38 = v2;
  do {
    bVar4 = bVar2;
    pFVar1 = v1->fStore;
    pFVar1[lVar3].val_ = fTangentVectors[transformationId * 2][lVar3];
    if (pFVar1[lVar3].dx_.num_elts != 0) {
      local_40 = 0.0;
      Vector<double>::operator=(&pFVar1[lVar3].dx_,&local_40);
    }
    pFVar1 = local_38->fStore;
    pFVar1[lVar3].val_ = fTangentVectors[transformationId * 2 + 1][lVar3];
    if (pFVar1[lVar3].dx_.num_elts != 0) {
      local_40 = 0.0;
      Vector<double>::operator=(&pFVar1[lVar3].dx_,&local_40);
    }
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlFaceDirections(TPZVec<TVar> &v1, TPZVec<TVar> &v2, int transformationId)
    {
        for (auto i=0; i< Dimension; i++){
            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            v1[i] = fTangentVectors[2*transformationId][i];
            v2[i] = fTangentVectors[2*transformationId + 1][i];
        }//for
    }